

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record.cpp
# Opt level: O2

void __thiscall ki::dml::Record::~Record(Record *this)

{
  pointer ppFVar1;
  pointer ppFVar2;
  
  for (ppFVar2 = (this->m_fields).
                 super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      ppFVar2 !=
      (this->m_fields).
      super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppFVar2 = ppFVar2 + 1) {
    if (*ppFVar2 != (FieldBase *)0x0) {
      (*((*ppFVar2)->super_Serializable)._vptr_Serializable[4])();
    }
  }
  ppFVar1 = (this->m_fields).
            super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppFVar2 != ppFVar1) {
    (this->m_fields).super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppFVar1;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::clear(&(this->m_field_map)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ki::dml::FieldBase_*>_>_>
  ::~_Rb_tree(&(this->m_field_map)._M_t);
  std::_Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>::~_Vector_base
            (&(this->m_fields).
              super__Vector_base<ki::dml::FieldBase_*,_std::allocator<ki::dml::FieldBase_*>_>);
  return;
}

Assistant:

Record::~Record()
	{
		for (auto it = m_fields.begin(); it != m_fields.end(); ++it)
			delete *it;
		m_fields.clear();
		m_field_map.clear();
	}